

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

optional<bound_token> *
read_bound(optional<bound_token> *__return_storage_ptr__,string_view_array *tokens)

{
  size_t sVar1;
  char *pcVar2;
  string_view str;
  string_view buf_1;
  string_view str_00;
  string_view buf;
  bool bVar3;
  long lVar4;
  string_view buf_2;
  string_view buf_00;
  string_view buf_1_00;
  string_view buf_1_01;
  optional<sub_bound_token> left_opt;
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> name_opt;
  optional<sub_bound_token> right_opt;
  _Storage<sub_bound_token,_true> local_70;
  char local_60;
  _Storage<sub_bound_token,_true> local_58;
  char local_48;
  _Storage<sub_bound_token,_true> local_40;
  char local_30;
  
  str._M_len = tokens->_M_elems[0]._M_len;
  str._M_str = tokens->_M_elems[0]._M_str;
  bVar3 = starts_with_number(str);
  if (bVar3) {
    buf_1._M_len = tokens->_M_elems[0]._M_len;
    buf_1._M_str = tokens->_M_elems[0]._M_str;
    read_left_bound_token
              ((optional<sub_bound_token> *)&local_70._M_value,buf_1,tokens->_M_elems[1],
               tokens->_M_elems[2],tokens->_M_elems[3]);
    if (local_60 == '\0') {
LAB_0012a2a0:
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_engaged = false;
      return __return_storage_ptr__;
    }
    lVar4 = (long)local_70._M_value.read;
    buf_00._M_str = tokens->_M_elems[lVar4]._M_str;
    buf_00._M_len = tokens->_M_elems[lVar4]._M_len;
    read_name((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_58._M_value
              ,buf_00);
    if (local_48 == '\0') goto LAB_0012a2a0;
    sVar1 = tokens->_M_elems[lVar4 + 1]._M_len;
    if ((sVar1 == 0) || (pcVar2 = tokens->_M_elems[lVar4 + 1]._M_str, 2 < (byte)(*pcVar2 - 0x3cU)))
    {
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.min = local_70._M_value.value;
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.max = INFINITY;
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.name._M_len =
           (size_t)local_58._M_value.value;
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.name._M_str =
           (char *)CONCAT44(local_58._M_value.op,local_58._M_value.read);
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.read =
           local_70._M_value.read + 2;
      goto LAB_0012a300;
    }
    buf_2._M_str = tokens->_M_elems[lVar4 + 2]._M_str;
    buf_2._M_len = tokens->_M_elems[lVar4 + 2]._M_len;
    buf_1_00._M_str = pcVar2;
    buf_1_00._M_len = sVar1;
    read_right_bound_token
              ((optional<sub_bound_token> *)&local_40._M_value,buf_1_00,buf_2,
               tokens->_M_elems[lVar4 + 3],tokens->_M_elems[lVar4 + 4]);
    if ((local_30 == '\x01') && (local_70._M_value.value <= local_40._M_value.value)) {
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.min = local_70._M_value.value;
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.max = local_40._M_value.value;
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.name._M_len =
           (size_t)local_58._M_value.value;
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.name._M_str =
           (char *)CONCAT44(local_58._M_value.op,local_58._M_value.read);
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.read =
           local_70._M_value.read + 1 + local_40._M_value.read;
      goto LAB_0012a29c;
    }
  }
  else {
    str_00._M_len = tokens->_M_elems[0]._M_len;
    str_00._M_str = tokens->_M_elems[0]._M_str;
    bVar3 = starts_with_name(str_00);
    if ((!bVar3) ||
       (buf._M_len = tokens->_M_elems[0]._M_len, buf._M_str = tokens->_M_elems[0]._M_str,
       read_name((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 &local_70._M_value,buf), local_60 == '\0')) goto LAB_0012a2a0;
    sVar1 = tokens->_M_elems[1]._M_len;
    if ((sVar1 == 0) || (pcVar2 = tokens->_M_elems[1]._M_str, 2 < (byte)(*pcVar2 - 0x3cU))) {
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.min = -INFINITY;
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.max = INFINITY;
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.name._M_len =
           (size_t)local_70._M_value.value;
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.name._M_str =
           (char *)CONCAT44(local_70._M_value.op,local_70._M_value.read);
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.read = 1;
LAB_0012a300:
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_engaged = true;
      return __return_storage_ptr__;
    }
    buf_1_01._M_str = pcVar2;
    buf_1_01._M_len = sVar1;
    read_right_bound_token
              ((optional<sub_bound_token> *)&local_58._M_value,buf_1_01,tokens->_M_elems[2],
               tokens->_M_elems[3],tokens->_M_elems[4]);
    if (local_48 == '\x01') {
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.min = 0.0;
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.max = local_58._M_value.value;
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.name._M_len =
           (size_t)local_70._M_value.value;
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.name._M_str =
           (char *)CONCAT44(local_70._M_value.op,local_70._M_value.read);
      (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<bound_token>._M_payload._M_value.read =
           local_58._M_value.read + 1;
LAB_0012a29c:
      bVar3 = true;
      goto LAB_0012a308;
    }
  }
  bVar3 = false;
LAB_0012a308:
  (__return_storage_ptr__->super__Optional_base<bound_token,_true,_true>)._M_payload.
  super__Optional_payload_base<bound_token>._M_engaged = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::optional<bound_token>
read_bound(const stream_buffer::string_view_array& tokens) noexcept
{
    if (starts_with_number(tokens[0])) {
        auto left_opt =
          read_left_bound_token(tokens[0], tokens[1], tokens[2], tokens[3]);
        if (!left_opt)
            return std::nullopt;

        int read = left_opt->read;

        auto name_opt = read_name(tokens[read]);
        if (!name_opt)
            return std::nullopt;

        ++read;

        if (!starts_with_operator(tokens[read]))
            return bound_token(left_opt->value,
                               std::numeric_limits<double>::infinity(),
                               *name_opt,
                               read + 1);

        auto right_opt = read_right_bound_token(
          tokens[read], tokens[read + 1], tokens[read + 2], tokens[read + 3]);
        if (!right_opt)
            return std::nullopt;

        if (left_opt->value > right_opt->value)
            return std::nullopt;

        return bound_token(left_opt->value,
                           right_opt->value,
                           *name_opt,
                           read + right_opt->read);
    }

    if (starts_with_name(tokens[0])) {
        auto name_opt = read_name(tokens[0]);
        if (!name_opt)
            return std::nullopt;

        if (starts_with_operator(tokens[1])) {
            auto right_opt = read_right_bound_token(
              tokens[1], tokens[2], tokens[3], tokens[4]);
            if (!right_opt)
                return std::nullopt;

            return bound_token(
              0.0, right_opt->value, *name_opt, 1 + right_opt->read);
        }

        return bound_token(-std::numeric_limits<double>::infinity(),
                           +std::numeric_limits<double>::infinity(),
                           *name_opt,
                           1);
    }

    return std::nullopt;
}